

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall
Fl_Preferences::RootNode::RootNode
          (RootNode *this,Fl_Preferences *prefs,Root root,char *vendor,char *application)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  void *__buf;
  int __fd;
  size_t __maxlen;
  char filename [2048];
  undefined8 uStack_830;
  char local_828 [2056];
  
  this->prefs_ = prefs;
  this->application_ = (char *)0x0;
  this->filename_ = (char *)0x0;
  this->vendor_ = (char *)0x0;
  local_828[0] = '\0';
  if (root != SYSTEM) {
    if (root != USER) goto LAB_001c29ec;
    uStack_830 = 0x1c298f;
    pcVar1 = fl_getenv("HOME");
    if (pcVar1 != (char *)0x0) {
      uStack_830 = 0x1c29a7;
      fl_strlcpy(local_828,pcVar1,0x800);
      uStack_830 = 0x1c29af;
      sVar2 = strlen(local_828);
      if (*(char *)((long)&uStack_830 + sVar2 + 7) == '/') {
        pcVar1 = ".fltk/";
      }
      else {
        pcVar1 = "/.fltk/";
      }
      uStack_830 = 0x1c29ec;
      fl_strlcat(local_828,pcVar1,0x800);
      goto LAB_001c29ec;
    }
  }
  builtin_strncpy(local_828,"/etc/fltk/",0xb);
LAB_001c29ec:
  uStack_830 = 0x1c29f7;
  sVar2 = strlen(local_828);
  __maxlen = 0x800 - sVar2;
  uStack_830 = 0x1c2a17;
  pcVar1 = vendor;
  snprintf(local_828 + sVar2,__maxlen,"%s/%s.prefs",vendor,application);
  __fd = (int)__maxlen;
  uStack_830 = 0x1c2a1f;
  pcVar3 = strdup(local_828);
  this->filename_ = pcVar3;
  uStack_830 = 0x1c2a2b;
  pcVar3 = strdup(vendor);
  this->vendor_ = pcVar3;
  uStack_830 = 0x1c2a37;
  pcVar3 = strdup(application);
  this->application_ = pcVar3;
  uStack_830 = 0x1c2a43;
  read(this,__fd,__buf,(size_t)pcVar1);
  return;
}

Assistant:

Fl_Preferences::RootNode::RootNode( Fl_Preferences *prefs, Root root, const char *vendor, const char *application )
: prefs_(prefs),
  filename_(0L),
  vendor_(0L),
  application_(0L) {

  char filename[ FL_PATH_MAX ]; filename[0] = 0;
#ifdef WIN32
#  define FLPREFS_RESOURCE	"Software\\Microsoft\\Windows\\CurrentVersion\\Explorer\\Shell Folders"
#  define FLPREFS_RESOURCEW	L"Software\\Microsoft\\Windows\\CurrentVersion\\Explorer\\Shell Folders"
  size_t appDataLen = strlen(vendor) + strlen(application) + 8;
  DWORD type, nn;
  LONG err;
  HKEY key;

  switch (root) {
    case SYSTEM:
      err = RegOpenKeyW( HKEY_LOCAL_MACHINE, FLPREFS_RESOURCEW, &key );
      if (err == ERROR_SUCCESS) {
        nn = (DWORD) (FL_PATH_MAX - appDataLen); 
        err = RegQueryValueExW( key, L"Common AppData", 0L, &type,
                                (BYTE*)filename, &nn ); 
        if ( ( err != ERROR_SUCCESS ) && ( type == REG_SZ ) ) {
          filename[0] = 0;
          filename[1] = 0;
        }
        RegCloseKey(key);
      }
      break;
    case USER:
      err = RegOpenKeyW( HKEY_CURRENT_USER, FLPREFS_RESOURCEW, &key );
      if (err == ERROR_SUCCESS) {
        nn = (DWORD) (FL_PATH_MAX - appDataLen);
        err = RegQueryValueExW( key, L"AppData", 0L, &type,
                                (BYTE*)filename, &nn ); 
        if ( ( err != ERROR_SUCCESS ) && ( type == REG_SZ ) ) {
          filename[0] = 0;
          filename[1] = 0;
	}
        RegCloseKey(key);
      }
      break;
  } 
  if (!filename[1] && !filename[0]) {
    strcpy(filename, "C:\\FLTK");
  } else {
#if 0
    xchar *b = (xchar*)_wcsdup((xchar *)filename);
#else
    // cygwin does not come with _wcsdup. Use malloc +  wcscpy.
    // For implementation of wcsdup functionality See
    // - http://linenum.info/p/glibc/2.7/wcsmbs/wcsdup.c
    xchar *b = (xchar*) malloc((wcslen((xchar *) filename) + 1) * sizeof(xchar));
    wcscpy(b, (xchar *) filename);
#endif
    //  filename[fl_unicode2utf(b, wcslen((xchar*)b), filename)] = 0;
    unsigned len = fl_utf8fromwc(filename, (FL_PATH_MAX-1), b, (unsigned) wcslen(b));
    filename[len] = 0;
    free(b);
  }
  snprintf(filename + strlen(filename), sizeof(filename) - strlen(filename),
           "/%s/%s.prefs", vendor, application);
  for (char *s = filename; *s; s++) if (*s == '\\') *s = '/';
#elif defined ( __APPLE__ )
  // TODO: verify that this is the Apple sanctioned way of finding these folders
  // (On MSWindows, this frequently leads to issues with internationalized systems)
  // Carbon: err = FindFolder( kLocalDomain, kPreferencesFolderType, 1, &spec.vRefNum, &spec.parID );
  switch (root) {
    case SYSTEM:
      strcpy(filename, "/Library/Preferences");
      break;
    case USER:
      sprintf(filename, "%s/Library/Preferences", fl_getenv("HOME"));
      break;
  }
  snprintf(filename + strlen(filename), sizeof(filename) - strlen(filename),
           "/%s/%s.prefs", vendor, application );
#else
  const char *e;
  switch (root) {
    case USER:
      if ((e = fl_getenv("HOME")) != NULL) {
	strlcpy(filename, e, sizeof(filename));

	if (filename[strlen(filename)-1] != '/') {
	  strlcat(filename, "/.fltk/", sizeof(filename));
	} else {
	  strlcat(filename, ".fltk/", sizeof(filename));
	}
	break;
      } 
    case SYSTEM:
      strcpy(filename, "/etc/fltk/");
      break;
  } 
  snprintf(filename + strlen(filename), sizeof(filename) - strlen(filename),
           "%s/%s.prefs", vendor, application);
#endif 
  filename_    = strdup(filename);
  vendor_      = strdup(vendor);
  application_ = strdup(application); 
  read();
}